

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itree.c
# Opt level: O3

cell_index_t
itree_find_tri(itree_t *t,cell_id_t left_context,cell_id_t right_context,cell_id_t posn)

{
  uint uVar1;
  cell_t *pcVar2;
  ulong uVar3;
  cell_index_t cVar4;
  
  pcVar2 = t->cell;
  if (pcVar2->id != 0xffffffff) {
    cVar4 = 0;
    do {
      if (pcVar2[cVar4].id == left_context) {
        uVar3 = (ulong)pcVar2[cVar4].child;
        if (uVar3 == 0xffffffff) {
          return 0xffffffff;
        }
        uVar1 = pcVar2[uVar3].id;
        while( true ) {
          if (uVar1 == 0xffffffff) {
            return 0xffffffff;
          }
          if (pcVar2[uVar3].id == right_context) break;
          uVar1 = pcVar2[uVar3].sib;
          uVar3 = (ulong)uVar1;
        }
        uVar3 = (ulong)pcVar2[uVar3].child;
        if (uVar3 == 0xffffffff) {
          return 0xffffffff;
        }
        uVar1 = pcVar2[uVar3].id;
        while( true ) {
          if (uVar1 == 0xffffffff) {
            return 0xffffffff;
          }
          if (pcVar2[uVar3].id == posn) break;
          uVar1 = pcVar2[uVar3].sib;
          uVar3 = (ulong)uVar1;
        }
        return pcVar2[uVar3].child;
      }
      cVar4 = pcVar2[cVar4].sib;
    } while (cVar4 != 0xffffffff);
  }
  return 0xffffffff;
}

Assistant:

cell_index_t itree_find(itree_t *t,
			cell_index_t *end,
			cell_index_t start,
			cell_id_t id)
{
    cell_t *cell;
    cell_index_t i, l = NO_ID, o;
    
    cell = t->cell;

    if (cell[start].id != NO_ID) {
	for (i = start; (i != NO_ID) && (cell[i].id != id); i = cell[i].sib)
	    l = i;

	if (i != NO_ID)
	    o = i;
	else 
	    o = NULL_INDEX;
    }
    else {
	o = NULL_INDEX;
	l = start;
    }

    *end = l;

    return o;
}